

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,Type *type,Imports *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  pointer pcVar3;
  long lVar4;
  long *plVar5;
  Import *pIVar6;
  size_type *psVar7;
  string local_88;
  string local_68;
  Type local_48;
  
  if (type->enum_def == (EnumDef *)0x0) {
    BVar2 = type->base_type;
    if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
      ScalarType_abi_cxx11_
                (__return_storage_ptr__,(PythonStubGenerator *)(ulong)BVar2,BASE_TYPE_NONE);
    }
    else {
      switch(BVar2) {
      case BASE_TYPE_STRING:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"str","");
        break;
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_ARRAY:
        paVar1 = &local_88.field_2;
        local_88._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"typing","");
        Imports::Import(imports,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        local_48.base_type = type->element;
        local_48.struct_def = type->struct_def;
        local_48.enum_def = type->enum_def;
        local_48.fixed_length = type->fixed_length;
        local_48.element = BASE_TYPE_NONE;
        TypeOf_abi_cxx11_(&local_68,this,&local_48,imports);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x37ae86);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_88.field_2._M_allocated_capacity = *psVar7;
          local_88.field_2._8_8_ = plVar5[3];
          local_88._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar7;
          local_88._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_88._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          lVar4 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        break;
      case BASE_TYPE_STRUCT:
        anon_unknown_0::PythonStubGenerator::ModuleFor<flatbuffers::StructDef>
                  (&local_88,(PythonStubGenerator *)this,type->struct_def);
        (**(code **)(*(long *)(this + 8) + 0x78))(&local_68,this + 8,type->struct_def);
        pIVar6 = Imports::Import(imports,&local_88,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = (pIVar6->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pIVar6->name)._M_string_length)
        ;
        break;
      case BASE_TYPE_UNION:
        UnionType_abi_cxx11_(__return_storage_ptr__,this,(EnumDef *)0x0,imports);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_python.cpp"
                      ,0xf2,
                      "std::string flatbuffers::python::(anonymous namespace)::PythonStubGenerator::TypeOf(const Type &, Imports *) const"
                     );
      }
    }
  }
  else {
    EnumType_abi_cxx11_(__return_storage_ptr__,this,type->enum_def,imports);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TypeOf(const Type &type, Imports *imports) const {
    if (type.enum_def != nullptr) return EnumType(*type.enum_def, imports);
    if (IsScalar(type.base_type)) return ScalarType(type.base_type);

    switch (type.base_type) {
      case BASE_TYPE_STRUCT: {
        const Import &import = imports->Import(ModuleFor(type.struct_def),
                                               namer_.Type(*type.struct_def));
        return import.name;
      }
      case BASE_TYPE_STRING:
        return "str";
      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR: {
        imports->Import("typing");
        return "typing.List[" + TypeOf(type.VectorType(), imports) + "]";
      }
      case BASE_TYPE_UNION:
        return UnionType(*type.enum_def, imports);
      default:
        FLATBUFFERS_ASSERT(0);
        return "";
    }
  }